

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flux_test.cpp
# Opt level: O1

void flux_test::getTarget(void)

{
  SystemImpl *this;
  FlowImpl *this_00;
  SystemImpl *pSVar1;
  
  this = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this);
  this_00 = (FlowImpl *)operator_new(0x38);
  FlowImpl::FlowImpl(this_00);
  *(undefined ***)this_00 = &PTR_execute_00106cb0;
  FlowImpl::setTarget((System *)this_00);
  pSVar1 = (SystemImpl *)(**(code **)(*(long *)this_00 + 0x10))(this_00);
  if (pSVar1 == this) {
    return;
  }
  __assert_fail("flux->getTarget() == s1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/unit_tests/flux_test.cpp"
                ,0x1c,"static void flux_test::getTarget()");
}

Assistant:

void flux_test::getTarget() {
    auto *s1 = new SystemImpl();
    auto *flux = new FlowExp();
    flux->setTarget(s1);
    assert(flux->getTarget() == s1);
}